

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

pointer poly::
        delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>>>,std::integral_constant<bool,true>>
        ::clone_func<Impl2T<poly::virtual_cloning_policy>>
                  (Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>
                   *a,pointer obj,void_pointer dest,Operation op)

{
  size_t sVar1;
  _func_int **pp_Var2;
  __atomic_base<unsigned_long> _Var3;
  
  if (op == Clone) {
    Impl2T<poly::virtual_cloning_policy>::Impl2T
              ((Impl2T<poly::virtual_cloning_policy> *)dest,
               (Impl2T<poly::virtual_cloning_policy> *)obj);
  }
  else {
    *(undefined ***)dest = &PTR___cxa_pure_virtual_002b4808;
    LOCK();
    UNLOCK();
    _Var3._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
    ((__atomic_base<unsigned_long> *)((long)dest + 8))->_M_i =
         (__int_type)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
    Interface::last_id.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    *(undefined1 *)((long)dest + 0x10) = 0;
    *(undefined ***)dest = &PTR_function_002b4840;
    sVar1 = obj[1].my_id;
    *(_func_int ***)((long)dest + 0x18) = obj[1]._vptr_Interface;
    *(size_t *)((long)dest + 0x20) = sVar1;
    obj[1]._vptr_Interface = (_func_int **)0x0;
    obj[1].my_id = 0;
    pp_Var2 = obj[2]._vptr_Interface;
    *(undefined8 *)((long)dest + 0x28) = *(undefined8 *)&obj[1].throw_on_copy_construction;
    *(_func_int ***)((long)dest + 0x30) = pp_Var2;
    *(size_t *)((long)dest + 0x38) = obj[2].my_id;
    *(undefined8 *)&obj[1].throw_on_copy_construction = 0;
    obj[2]._vptr_Interface = (_func_int **)0x0;
    obj[2].my_id = 8;
    *(undefined8 *)((long)dest + 0x40) = *(undefined8 *)&obj[2].throw_on_copy_construction;
    *(undefined8 *)&obj[2].throw_on_copy_construction = 0;
    *(undefined4 *)((long)dest + 0x48) = 0xdeadbeef;
  }
  return (pointer)dest;
}

Assistant:

static pointer clone_func(const Allocator& a, pointer obj, void_pointer dest, Operation op)
    {
        using traits      = typename std::allocator_traits<Allocator>::template rebind_traits<T>;
        using obj_pointer = typename traits::pointer;
        using obj_const_pointer = typename traits::const_pointer;

        typename traits::allocator_type alloc(a);
        if (op == Clone) {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), *static_cast<obj_const_pointer>(obj));
        } else {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), std::move(*static_cast<obj_pointer>(obj)));
        }
        return static_cast<obj_pointer>(dest);
    }